

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall
soplex::SoPlexBase<double>::_solveRealLPAndRecordStatistics
          (SoPlexBase<double> *this,bool *interrupt)

{
  SPxSolverBase<double> *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Representation RVar5;
  Tolerances *pTVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  Statistics *pSVar8;
  Type TVar9;
  int iVar10;
  Settings *pSVar11;
  int iVar12;
  Representation RVar13;
  Type tp;
  Verbosity old_verbosity;
  bool bVar14;
  double extraout_XMM0_Qa;
  Real RVar15;
  Real RVar16;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar17;
  double dVar18;
  
  pSVar11 = this->_currentSettings;
  dVar17 = pSVar11->_realParamValues[6];
  iVar10 = -1;
  if ((double)pSVar11->_intParamValues[5] < dVar17) {
    iVar12 = pSVar11->_intParamValues[5] - this->_statistics->iterations;
    iVar10 = -1;
    if (-1 < iVar12) {
      iVar10 = iVar12;
    }
  }
  bVar14 = this->_hasBasis;
  (this->_solver).maxIters = iVar10;
  dVar18 = pSVar11->_realParamValues[7];
  if (dVar18 < dVar17) {
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    dVar17 = dVar18 - extraout_XMM0_Qa;
  }
  RVar15 = 0.0;
  if (0.0 <= dVar17) {
    RVar15 = dVar17;
  }
  (this->_solver).maxTime = RVar15;
  RVar15 = Tolerances::epsilon((this->_solver).super_SPxLPBase<double>._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  pTVar6 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  RVar16 = Tolerances::floatingPointFeastol(pTVar6);
  dVar17 = RVar15 * 10000.0;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  if (RVar16 < dVar17) {
    pTVar6 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    Tolerances::setFloatingPointFeastol(pTVar6,dVar17);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
  }
  pTVar6 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  RVar15 = Tolerances::floatingPointOpttol(pTVar6);
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  if (RVar15 < dVar17) {
    pTVar6 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    Tolerances::setFloatingPointOpttol(pTVar6,dVar17);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
  }
  this_00 = &this->_solver;
  iVar10 = this->_currentSettings->_intParamValues[1];
  if (iVar10 == 2) {
    RVar13 = ROW;
    if ((this->_solver).theRep != ROW) {
LAB_0033c032:
      SPxSolverBase<double>::initRep(this_00,RVar13);
    }
  }
  else if (iVar10 == 1) {
    RVar13 = COLUMN;
    if ((this->_solver).theRep != COLUMN) goto LAB_0033c032;
  }
  else if (iVar10 == 0) {
    dVar17 = (double)((this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                      super_SVSetBase<double>.set.thenum + 1) *
             this->_currentSettings->_realParamValues[0x10];
    dVar18 = (double)((this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set.thenum + 1);
    RVar5 = (this->_solver).theRep;
    RVar13 = COLUMN;
    if ((RVar5 != COLUMN && dVar18 <= dVar17) || (RVar13 = ROW, RVar5 != ROW && dVar17 < dVar18))
    goto LAB_0033c032;
  }
  iVar10 = this->_currentSettings->_intParamValues[2];
  if (iVar10 == 1) {
    TVar9 = (this->_solver).theType;
    RVar13 = (this->_solver).theRep;
    tp = ENTER;
    if (TVar9 == ENTER || RVar13 != ROW) {
      if (RVar13 != COLUMN) goto LAB_0033c0b2;
LAB_0033c0a0:
      tp = LEAVE;
      if (TVar9 == LEAVE) goto LAB_0033c0b2;
    }
  }
  else {
    if (iVar10 != 0) goto LAB_0033c0b2;
    TVar9 = (this->_solver).theType;
    RVar13 = (this->_solver).theRep;
    tp = ENTER;
    if (TVar9 == ENTER || RVar13 != COLUMN) {
      if (RVar13 != ROW) goto LAB_0033c0b2;
      goto LAB_0033c0a0;
    }
  }
  SPxSolverBase<double>::setType(this_00,tp);
LAB_0033c0b2:
  pSVar11 = this->_currentSettings;
  (this->_solver).sparsePricingFactor = pSVar11->_realParamValues[0xf];
  iVar10 = pSVar11->_intParamValues[0x14];
  if (iVar10 == 0) {
    (this->_solver).hyperPricingLeave = false;
    (this->_solver).hyperPricingEnter = false;
  }
  else if ((iVar10 == 2) ||
          ((iVar10 == 1 &&
           (5000 < (this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum +
                   (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum)))) {
    (this->_solver).hyperPricingLeave = true;
    (this->_solver).hyperPricingEnter = true;
    DIdxSet::setMax(&(this->_solver).updateViols,(((this->_solver).thecovectors)->set).thenum);
    DIdxSet::setMax(&(this->_solver).updateViolsCo,(((this->_solver).thevectors)->set).thenum);
    pSVar11 = this->_currentSettings;
  }
  (this->_solver).super_SPxBasisBase<double>.nonzeroFactor = pSVar11->_realParamValues[0x13];
  (this->_solver).super_SPxBasisBase<double>.fillFactor = pSVar11->_realParamValues[0x14];
  (this->_solver).super_SPxBasisBase<double>.memFactor = pSVar11->_realParamValues[0x15];
  (*this->_statistics->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<double>::solve(this_00,interrupt,true);
  (*this->_statistics->simplexTime->_vptr_Timer[4])();
  iVar10 = (this->_solver).super_SPxBasisBase<double>.iterCount;
  if ((0 < iVar10) && ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED)) {
    SLUFactorRational::init(&this->_rationalLUSolver,(EVP_PKEY_CTX *)interrupt);
    iVar10 = (this->_solver).super_SPxBasisBase<double>.iterCount;
  }
  pSVar8 = this->_statistics;
  pSVar8->iterations = pSVar8->iterations + iVar10;
  iVar12 = iVar10;
  if (iVar10 != 0) {
    iVar12 = (this->_solver).primalCount;
  }
  pSVar8->iterationsPrimal = pSVar8->iterationsPrimal + iVar12;
  iVar12 = 0;
  if (bVar14 != false) {
    iVar12 = iVar10;
  }
  pSVar8->iterationsFromBasis = pSVar8->iterationsFromBasis + iVar12;
  pSVar8->iterationsPolish = pSVar8->iterationsPolish + (this->_solver).polishCount;
  pSVar8->boundflips = pSVar8->boundflips + (this->_solver).totalboundflips;
  (*((this->_solver).multTimeSparse)->_vptr_Timer[6])();
  this->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + this->_statistics->multTimeSparse;
  (*((this->_solver).multTimeFull)->_vptr_Timer[6])();
  this->_statistics->multTimeFull = extraout_XMM0_Qa_01 + this->_statistics->multTimeFull;
  (*((this->_solver).multTimeColwise)->_vptr_Timer[6])();
  this->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + this->_statistics->multTimeColwise;
  (*((this->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  pSVar8 = this->_statistics;
  pSVar8->multTimeUnsetup = extraout_XMM0_Qa_03 + pSVar8->multTimeUnsetup;
  uVar1 = (this->_solver).multSparseCalls;
  uVar2 = (this->_solver).multFullCalls;
  uVar3 = (this->_solver).multColwiseCalls;
  uVar4 = (this->_solver).multUnsetupCalls;
  pSVar8->multSparseCalls = pSVar8->multSparseCalls + uVar1;
  pSVar8->multFullCalls = pSVar8->multFullCalls + uVar2;
  pSVar8->multColwiseCalls = pSVar8->multColwiseCalls + uVar3;
  pSVar8->multUnsetupCalls = pSVar8->multUnsetupCalls + uVar4;
  (*((this->_slufactor).super_CLUFactor<double>.factorTime)->_vptr_Timer[6])();
  this->_statistics->luFactorizationTimeReal =
       extraout_XMM0_Qa_04 + this->_statistics->luFactorizationTimeReal;
  (*((this->_slufactor).solveTime)->_vptr_Timer[6])();
  pSVar8 = this->_statistics;
  pSVar8->luSolveTimeReal = extraout_XMM0_Qa_05 + pSVar8->luSolveTimeReal;
  pSVar8->luFactorizationsReal =
       pSVar8->luFactorizationsReal + (this->_slufactor).super_CLUFactor<double>.factorCount;
  pSVar8->luSolvesReal = pSVar8->luSolvesReal + (this->_slufactor).solveCount;
  (*((this->_slufactor).super_CLUFactor<double>.factorTime)->_vptr_Timer[2])();
  (*((this->_slufactor).solveTime)->_vptr_Timer[2])();
  (this->_slufactor).super_CLUFactor<double>.factorCount = 0;
  (this->_slufactor).super_CLUFactor<double>.hugeValues = 0;
  (this->_slufactor).solveCount = 0;
  bVar14 = (this->_solver).theRep == ROW;
  pSVar8 = this->_statistics;
  pSVar8->degenPivotsPrimal = pSVar8->degenPivotsPrimal + (&(this->_solver).enterCycles)[bVar14];
  pSVar8->degenPivotsDual = pSVar8->degenPivotsDual + (&(this->_solver).enterCycles)[!bVar14];
  dVar17 = (this->_solver).primalDegenSum;
  pSVar8->sumDualDegen = pSVar8->sumDualDegen + (this->_solver).dualDegenSum;
  pSVar8->sumPrimalDegen = pSVar8->sumPrimalDegen + dVar17;
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}